

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int64_t test_string_compare(char *a,char *b)

{
  char cVar1;
  long lVar2;
  int64_t iStack_8;
  
  if (a == b) {
    return 0;
  }
  if (a == (char *)0x0) {
    iStack_8 = -1;
  }
  else {
    if (b != (char *)0x0) {
      lVar2 = 0;
      while( true ) {
        cVar1 = a[lVar2];
        if (cVar1 != b[lVar2]) {
          return (long)cVar1 - (long)b[lVar2];
        }
        if (cVar1 == '\0') break;
        lVar2 = lVar2 + 1;
      }
      return 0;
    }
    iStack_8 = 1;
  }
  return iStack_8;
}

Assistant:

int64_t test_string_compare(const char *a, const char *b)
{
  if (a == b)
  {
    return 0;
  }
  if (a == nullptr)
  {
    return -1;
  }
  if (b == nullptr)
  {
    return +1;
  }

  for (;;)
  {
    if (*a != *b)
    {
      return *a - *b;
    }

    // We only need to check 'a' here since we already verified they are the
    // same above.
    if (*a == 0)
    {
      return 0;
    }

    ++a;
    ++b;
  }
}